

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_shli_i32_ppc(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  TCGv_i32 arg2_00;
  TCGv_i32 t0;
  int32_t arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if (arg2 == 0) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg1);
  }
  else {
    arg2_00 = tcg_const_i32_ppc(tcg_ctx,arg2);
    tcg_gen_shl_i32(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_i32(tcg_ctx,arg2_00);
  }
  return;
}

Assistant:

void tcg_gen_shli_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    tcg_debug_assert(arg2 >= 0 && arg2 < 32);
    if (arg2 == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_shl_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}